

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::ExtensionSet::FindExtensionInfoFromTag
          (ExtensionSet *this,uint32 tag,ExtensionFinder *extension_finder,int *field_number,
          ExtensionInfo *extension)

{
  byte bVar1;
  int iVar2;
  LogMessage *other;
  bool bVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  *field_number = tag >> 3;
  iVar2 = (*extension_finder->_vptr_ExtensionFinder[2])
                    (extension_finder,(ulong)(tag >> 3),extension);
  bVar3 = true;
  if ((char)iVar2 != '\0') {
    if (extension->is_packed == true) {
      bVar3 = (tag & 7) == 2;
    }
    else {
      bVar1 = extension->type;
      if ((byte)(bVar1 - 0x13) < 0xee) {
        LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                   ,0x35);
        other = LogMessage::operator<<
                          (&local_50,
                           "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
        LogFinisher::operator=(&local_51,other);
        LogMessage::~LogMessage(&local_50);
      }
      bVar3 = (tag & 7) == *(uint *)(WireFormatLite::kWireTypeForFieldType + (ulong)bVar1 * 4);
    }
    bVar3 = !bVar3;
  }
  return (bool)(bVar3 ^ 1);
}

Assistant:

bool ExtensionSet::FindExtensionInfoFromTag(
    uint32 tag, ExtensionFinder* extension_finder,
    int* field_number, ExtensionInfo* extension) {
  *field_number = WireFormatLite::GetTagFieldNumber(tag);
  WireFormatLite::WireType wire_type = WireFormatLite::GetTagWireType(tag);

  bool is_unknown;
  if (!extension_finder->Find(*field_number, extension)) {
    is_unknown = true;
  } else if (extension->is_packed) {
    is_unknown = (wire_type != WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
  } else {
    WireFormatLite::WireType expected_wire_type =
        WireFormatLite::WireTypeForFieldType(real_type(extension->type));
    is_unknown = (wire_type != expected_wire_type);
  }
  return !is_unknown;
}